

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

DataBuffer * __thiscall BotscriptParser::currentBuffer(BotscriptParser *this)

{
  BotscriptParser *this_local;
  
  if (this->m_switchBuffer == (DataBuffer *)0x0) {
    if (this->m_currentMode == MainLoop) {
      this_local = (BotscriptParser *)this->m_mainLoopBuffer;
    }
    else if (this->m_currentMode == Onenter) {
      this_local = (BotscriptParser *)this->m_onenterBuffer;
    }
    else {
      this_local = (BotscriptParser *)this->m_mainBuffer;
    }
  }
  else {
    this_local = (BotscriptParser *)this->m_switchBuffer;
  }
  return (DataBuffer *)this_local;
}

Assistant:

DataBuffer* BotscriptParser::currentBuffer()
{
	if (m_switchBuffer != nullptr)
		return m_switchBuffer;

	if (m_currentMode == ParserMode::MainLoop)
		return m_mainLoopBuffer;

	if (m_currentMode == ParserMode::Onenter)
		return m_onenterBuffer;

	return m_mainBuffer;
}